

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_TypeRules.h
# Opt level: O3

int64_t soul::TypeRules::checkAndGetArrayIndex<soul::CodeLocation&>
                  (CodeLocation *errorContext,Value *index)

{
  Category CVar1;
  int64_t iVar2;
  PackedData local_60;
  CompileMessage local_48;
  
  CVar1 = (index->type).category;
  if ((CVar1 == primitive && 0xfffffffd < (index->type).primitiveType.type - bool_ ||
       (CVar1 & ~primitive) == wrap) && (((index->type).isRef & 1U) == 0)) {
    soul::Value::getData(&local_60,index);
    iVar2 = soul::Value::PackedData::getAsInt64(&local_60);
    return iVar2;
  }
  CompileMessageHelpers::createMessage<>
            (&local_48,syntax,error,"An array index must be an integer type");
  CodeLocation::throwError(errorContext,&local_48);
}

Assistant:

static int64_t checkAndGetArrayIndex (Thrower&& errorContext, const Value& index)
    {
        if (! arraySizeTypeIsOK (index.getType()))
            errorContext.throwError (Errors::nonIntegerArrayIndex());

        return index.getAsInt64();
    }